

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiff_io.cc
# Opt level: O3

void __thiscall gimage::anon_unknown_6::TiffImage<float>::~TiffImage(TiffImage<float> *this)

{
  pointer puVar1;
  pointer pfVar2;
  
  TIFFClose(this->tif);
  puVar1 = (this->raw).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  pfVar2 = (this->row).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pfVar2 != (pointer)0x0) {
    operator_delete(pfVar2);
  }
  Image<float,_gimage::PixelTraits<float>_>::~Image(&this->rows);
  return;
}

Assistant:

~TiffImage()
    {
      TIFFClose(tif);
    }